

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::push
          (QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *this,
          Intersection *x)

{
  quint64 *pqVar1;
  quint64 *pqVar2;
  Intersection *pIVar3;
  QPodPoint QVar4;
  quint64 qVar5;
  quint64 qVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  quint64 qVar9;
  qsizetype qVar10;
  undefined4 uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  
  qVar10 = (this->m_data).siz;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::add(&this->m_data,x);
  iVar14 = (int)qVar10;
  while( true ) {
    iVar13 = (iVar14 + -1) / 2;
    if (iVar14 == 0) break;
    bVar12 = QIntersectionPoint::operator<
                       (&x->intersectionPoint,&(this->m_data).buffer[iVar13].intersectionPoint);
    if (!bVar12) break;
    pIVar3 = (this->m_data).buffer;
    uVar11 = *(undefined4 *)&pIVar3[iVar13].field_0x34;
    pIVar3[iVar14].rightEdge = pIVar3[iVar13].rightEdge;
    *(undefined4 *)&pIVar3[iVar14].field_0x34 = uVar11;
    QVar4 = pIVar3[iVar13].intersectionPoint.upperLeft;
    qVar5 = pIVar3[iVar13].intersectionPoint.xOffset.numerator;
    pqVar1 = &pIVar3[iVar13].intersectionPoint.xOffset.denominator;
    qVar6 = *pqVar1;
    uVar7 = pqVar1[1];
    pqVar1 = &pIVar3[iVar13].intersectionPoint.yOffset.denominator;
    uVar8 = pqVar1[1];
    pqVar2 = &pIVar3[iVar14].intersectionPoint.yOffset.denominator;
    *pqVar2 = *pqVar1;
    pqVar2[1] = uVar8;
    pqVar1 = &pIVar3[iVar14].intersectionPoint.xOffset.denominator;
    *pqVar1 = qVar6;
    pqVar1[1] = uVar7;
    pIVar3[iVar14].intersectionPoint.upperLeft = QVar4;
    pIVar3[iVar14].intersectionPoint.xOffset.numerator = qVar5;
    iVar14 = iVar13;
  }
  pIVar3 = (this->m_data).buffer;
  uVar11 = *(undefined4 *)&x->field_0x34;
  pIVar3[iVar14].rightEdge = x->rightEdge;
  *(undefined4 *)&pIVar3[iVar14].field_0x34 = uVar11;
  QVar4 = (x->intersectionPoint).upperLeft;
  qVar5 = (x->intersectionPoint).xOffset.numerator;
  qVar6 = (x->intersectionPoint).xOffset.denominator;
  qVar9 = (x->intersectionPoint).yOffset.numerator;
  uVar7 = *(undefined8 *)&x->vertex;
  pqVar1 = &pIVar3[iVar14].intersectionPoint.yOffset.denominator;
  *pqVar1 = (x->intersectionPoint).yOffset.denominator;
  pqVar1[1] = uVar7;
  pqVar1 = &pIVar3[iVar14].intersectionPoint.xOffset.denominator;
  *pqVar1 = qVar6;
  pqVar1[1] = qVar9;
  pIVar3[iVar14].intersectionPoint.upperLeft = QVar4;
  pIVar3[iVar14].intersectionPoint.xOffset.numerator = qVar5;
  return;
}

Assistant:

void QMaxHeap<T>::push(const T &x)
{
    int current = m_data.size();
    int parent = QMaxHeap::parent(current);
    m_data.add(x);
    while (current != 0 && m_data.at(parent) < x) {
        m_data.at(current) = m_data.at(parent);
        current = parent;
        parent = QMaxHeap::parent(current);
    }
    m_data.at(current) = x;
}